

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmio.c
# Opt level: O3

int mm_read_mtx_crd_data(FILE *f,int M,int N,int nz,int *I,int *J,double *val,char *matcode)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  
  cVar1 = matcode[2];
  if (cVar1 == 'C') {
    if (0 < nz) {
      uVar3 = (ulong)(uint)nz;
      do {
        iVar2 = __isoc99_fscanf(f,"%d %d %lg %lg",I,J,val,val + 1);
        if (iVar2 != 4) {
          return 0xc;
        }
        J = J + 1;
        I = I + 1;
        val = val + 2;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
    }
  }
  else if (cVar1 == 'R') {
    if (0 < nz) {
      uVar3 = (ulong)(uint)nz;
      do {
        iVar2 = __isoc99_fscanf(f,"%d %d %lg\n",I,J,val);
        if (iVar2 != 3) {
          return 0xc;
        }
        val = val + 1;
        J = J + 1;
        I = I + 1;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
    }
  }
  else {
    if (cVar1 != 'P') {
      return 0xf;
    }
    if (0 < nz) {
      uVar3 = (ulong)(uint)nz;
      do {
        iVar2 = __isoc99_fscanf(f,"%d %d",I,J);
        if (iVar2 != 2) {
          return 0xc;
        }
        J = J + 1;
        I = I + 1;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
    }
  }
  return 0;
}

Assistant:

int mm_read_mtx_crd_data(FILE *f, int M, int N, int nz, int I[], int J[],
                         double val[], MM_typecode matcode) {
    int i;
    if (mm_is_complex(matcode)) {
        for (i = 0; i < nz; i++)
            if (fscanf(f, "%d %d %lg %lg", &I[i], &J[i], &val[2 * i], &val[2 * i + 1])
                != 4)
                return MM_PREMATURE_EOF;
    } else if (mm_is_real(matcode)) {
        for (i = 0; i < nz; i++) {
            if (fscanf(f, "%d %d %lg\n", &I[i], &J[i], &val[i])
                != 3)
                return MM_PREMATURE_EOF;

        }
    } else if (mm_is_pattern(matcode)) {
        for (i = 0; i < nz; i++)
            if (fscanf(f, "%d %d", &I[i], &J[i])
                != 2)
                return MM_PREMATURE_EOF;
    } else
        return MM_UNSUPPORTED_TYPE;

    return 0;

}